

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_pcrv_tec_zone(REF_GRID ref_grid,REF_INT edgeid,REF_INT faceid,REF_INT sense,FILE *file)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  uint uVar4;
  void *__ptr;
  undefined8 uVar6;
  REF_GEOM ref_geom;
  REF_INT RVar7;
  int node;
  char *pcVar8;
  int iVar9;
  long lVar10;
  REF_DBL *pRVar11;
  FILE *pFVar12;
  long lVar13;
  REF_DBL RVar14;
  REF_INT local;
  REF_INT sens;
  REF_INT local_16c;
  REF_DICT ref_dict;
  REF_DBL radius;
  int local_154;
  REF_GEOM local_150;
  void *local_148;
  REF_DBL local_140;
  FILE *local_138;
  ulong local_130;
  REF_DBL gap;
  REF_DBL tvalue;
  void *local_118;
  ulong local_110;
  REF_DBL xyz [3];
  REF_INT nodes [27];
  REF_DBL normal [3];
  ulong uVar5;
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  ref_geom = ref_grid->geom;
  uVar2 = ref_dict_create(&ref_dict);
  if (uVar2 != 0) {
    uVar5 = (ulong)uVar2;
    pcVar8 = "create dict";
    uVar6 = 0xc17;
    goto LAB_0014f50e;
  }
  local_150 = (REF_GEOM)CONCAT44(local_150._4_4_,faceid);
  local_140 = (REF_DBL)CONCAT44(local_140._4_4_,0xffffffff);
  lVar10 = 0;
  local_16c = sense;
  local_138 = (FILE *)file;
  for (lVar13 = 0; lVar13 < ref_geom->max; lVar13 = lVar13 + 1) {
    pRVar1 = ref_geom->descr;
    if ((*(int *)((long)pRVar1 + lVar10) == 1) && (*(int *)((long)pRVar1 + lVar10 + 4) == edgeid)) {
      uVar2 = ref_dict_store(ref_dict,*(REF_INT *)((long)pRVar1 + lVar10 + 0x14),(REF_INT)lVar13);
      if (uVar2 != 0) {
        uVar5 = (ulong)uVar2;
        pcVar8 = "mark nodes";
        uVar6 = 0xc1c;
        goto LAB_0014f50e;
      }
      if (*(int *)((long)ref_geom->descr + lVar10 + 0xc) != 0) {
        if (local_140._0_4_ != -1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xc1e,"ref_geom_pcrv_tec_zone","should be only one jump per edge",
                 0xffffffffffffffff,(long)local_140._0_4_);
          return 1;
        }
        local_140 = (REF_DBL)CONCAT44(local_140._4_4_,(REF_INT)lVar13);
      }
    }
    lVar10 = lVar10 + 0x18;
  }
  local_110 = (ulong)(uint)ref_dict->n;
  local_130 = (ulong)(local_140._0_4_ != -1);
  uVar2 = 0;
  for (iVar9 = 0; pFVar12 = local_138, iVar9 < ref_cell->max; iVar9 = iVar9 + 1) {
    RVar3 = ref_cell_nodes(ref_cell,iVar9,nodes);
    uVar2 = uVar2 + (nodes[2] == edgeid && RVar3 == 0);
  }
  uVar4 = (int)local_130 + (int)local_110;
  uVar5 = (ulong)uVar4;
  local_130 = uVar5;
  if ((uVar4 == 0) || (uVar2 == 0)) {
    uVar2 = ref_dict_free(ref_dict);
    if (uVar2 != 0) {
      uVar5 = (ulong)uVar2;
      pcVar8 = "free dict";
      uVar6 = 0xc2f;
      goto LAB_0014f50e;
    }
  }
  else {
    fprintf(local_138,"zone t=\"pcrv%df%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)edgeid,(ulong)local_150 & 0xffffffff,uVar5,(ulong)uVar2,"point","felineseg"
           );
    if ((int)uVar4 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xc38,
             "ref_geom_pcrv_tec_zone","malloc t of REF_DBL negative");
      return 1;
    }
    local_148 = malloc(uVar5 << 3);
    if (local_148 == (void *)0x0) {
      pcVar8 = "malloc t of REF_DBL NULL";
      uVar6 = 0xc38;
LAB_0014f939:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
             "ref_geom_pcrv_tec_zone",pcVar8);
      return 2;
    }
    __ptr = malloc((ulong)(uVar4 * 2) << 3);
    if (__ptr == (void *)0x0) {
      pcVar8 = "malloc uv of REF_DBL NULL";
      uVar6 = 0xc39;
      goto LAB_0014f939;
    }
    local_154 = uVar4 - 1;
    local_118 = __ptr;
    for (iVar9 = 0; iVar9 < ref_cell->max; iVar9 = iVar9 + 1) {
      RVar3 = ref_cell_nodes(ref_cell,iVar9,nodes);
      if ((RVar3 == 0) && (nodes[2] == edgeid)) {
        uVar2 = ref_dict_location(ref_dict,nodes[0],&local);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xc40,"ref_geom_pcrv_tec_zone",(ulong)uVar2,"localize");
          printf("edg %d %d id %d no edge geom\n",(ulong)(uint)nodes[0],(ulong)(uint)nodes[1],
                 (ulong)(uint)nodes[2]);
          uVar4 = ref_node_location(ref_node,nodes[0]);
          if (uVar4 == 0) {
            ref_geom_tattle(ref_geom,nodes[0]);
            return uVar2;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xc3e,"ref_geom_pcrv_tec_zone",(ulong)uVar4,"loc");
          return uVar4;
        }
        uVar2 = ref_geom_cell_tuv(ref_geom,nodes[0],nodes,1,&tvalue,&sens);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "from";
          uVar6 = 0xc43;
          goto LAB_0014f50e;
        }
        if (sens == -1) {
          local = local_154;
        }
        *(REF_DBL *)((long)local_148 + (long)local * 8) = tvalue;
        uVar2 = ref_egads_edge_face_uv
                          (ref_geom,edgeid,(REF_INT)local_150,local_16c,tvalue,
                           (REF_DBL *)((long)local_118 + (long)(local * 2) * 8));
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "p-curve uv";
          uVar6 = 0xc48;
          goto LAB_0014f50e;
        }
        uVar2 = ref_dict_location(ref_dict,nodes[1],&local);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "localize";
          uVar6 = 0xc49;
          goto LAB_0014f50e;
        }
        uVar2 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&tvalue,&sens);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "from";
          uVar6 = 0xc4c;
          goto LAB_0014f50e;
        }
        if (sens == -1) {
          local = local_154;
        }
        *(REF_DBL *)((long)local_148 + (long)local * 8) = tvalue;
        uVar2 = ref_egads_edge_face_uv
                          (ref_geom,edgeid,(REF_INT)local_150,local_16c,tvalue,
                           (REF_DBL *)((long)local_118 + (long)(local * 2) * 8));
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "p-curve uv";
          uVar6 = 0xc51;
          goto LAB_0014f50e;
        }
      }
    }
    iVar9 = ref_dict->n;
    RVar7 = -1;
    node = -1;
    if (0 < iVar9) {
      node = *ref_dict->key;
      RVar7 = *ref_dict->value;
    }
    lVar10 = 0;
    while (lVar13 = lVar10, lVar13 < iVar9) {
      radius = 0.0;
      gap = 0.0;
      pRVar11 = ref_node->real;
      lVar10 = (long)(node * 0xf);
      xyz[0] = pRVar11[lVar10];
      xyz[1] = pRVar11[lVar10 + 1];
      xyz[2] = pRVar11[lVar10 + 2];
      if (ref_geom->model == (void *)0x0) {
        RVar14 = *(REF_DBL *)((long)local_148 + lVar13 * 8);
      }
      else {
        uVar2 = ref_egads_edge_curvature(ref_geom,RVar7,&radius,normal);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "curve";
          uVar6 = 0xc5c;
          goto LAB_0014f50e;
        }
        if (radius <= -radius) {
          radius = -radius;
        }
        RVar14 = *(REF_DBL *)((long)local_148 + lVar13 * 8);
        pRVar11 = (REF_DBL *)(lVar13 * 0x10 + (long)local_118);
        RVar7 = (REF_INT)local_150;
        uVar2 = ref_egads_edge_face_uv(ref_geom,edgeid,(REF_INT)local_150,local_16c,RVar14,pRVar11);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "p-curve uv";
          uVar6 = 0xc60;
          goto LAB_0014f50e;
        }
        uVar2 = ref_egads_eval_at(ref_geom,2,RVar7,pRVar11,xyz,(REF_DBL *)0x0);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "eval at";
          uVar6 = 0xc63;
          goto LAB_0014f50e;
        }
        uVar2 = ref_egads_gap(ref_geom,node,&gap);
        pFVar12 = local_138;
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "gap";
          uVar6 = 0xc64;
          goto LAB_0014f50e;
        }
      }
      fprintf(pFVar12," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",xyz[0],xyz[1],xyz[2],gap,
              *(undefined8 *)((long)__ptr + lVar13 * 0x10),
              *(undefined8 *)((long)__ptr + lVar13 * 0x10 + 8),radius,RVar14);
      lVar10 = lVar13 + 1;
      iVar9 = ref_dict->n;
      RVar7 = -1;
      node = -1;
      if ((int)lVar10 < iVar9) {
        node = ref_dict->key[lVar13 + 1];
        RVar7 = ref_dict->value[lVar13 + 1];
      }
    }
    if (local_140._0_4_ != -1) {
      iVar9 = ref_geom->descr[(long)(local_140._0_4_ * 6) + 5];
      lVar10 = (long)iVar9;
      radius = 0.0;
      gap = 0.0;
      pRVar11 = ref_node->real;
      xyz[0] = pRVar11[lVar10 * 0xf];
      xyz[1] = pRVar11[lVar10 * 0xf + 1];
      xyz[2] = pRVar11[lVar10 * 0xf + 2];
      if (ref_geom->model == (void *)0x0) {
        RVar14 = *(REF_DBL *)((long)local_148 + local_110 * 8);
        uVar5 = (ulong)(uint)((int)local_110 * 2);
      }
      else {
        uVar2 = ref_egads_edge_curvature(ref_geom,local_140._0_4_,&radius,normal);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "curve";
          uVar6 = 0xc73;
          goto LAB_0014f50e;
        }
        if (radius <= -radius) {
          radius = -radius;
        }
        local_140 = *(REF_DBL *)((long)local_148 + local_110 * 8);
        pRVar11 = (REF_DBL *)((long)local_118 + local_110 * 0x10);
        uVar2 = ref_egads_edge_face_uv
                          (ref_geom,edgeid,(REF_INT)local_150,local_16c,local_140,pRVar11);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "p-curve uv";
          uVar6 = 0xc77;
          goto LAB_0014f50e;
        }
        uVar2 = ref_egads_eval_at(ref_geom,2,(REF_INT)local_150,pRVar11,xyz,(REF_DBL *)0x0);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "eval at";
          uVar6 = 0xc7a;
          goto LAB_0014f50e;
        }
        local_150 = ref_geom;
        uVar2 = ref_egads_gap(ref_geom,iVar9,&gap);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "gap";
          uVar6 = 0xc7b;
          goto LAB_0014f50e;
        }
        uVar5 = local_110 * 2;
        ref_geom = local_150;
        pFVar12 = local_138;
        RVar14 = local_140;
      }
      fprintf(pFVar12," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",xyz[0],xyz[1],xyz[2],gap,
              *(undefined8 *)((long)__ptr + uVar5 * 8),
              *(undefined8 *)((long)__ptr + (uVar5 & 0xffffffff) * 8 + 8),radius,RVar14);
    }
    free(__ptr);
    free(local_148);
    for (iVar9 = 0; iVar9 < ref_cell->max; iVar9 = iVar9 + 1) {
      RVar3 = ref_cell_nodes(ref_cell,iVar9,nodes);
      if ((RVar3 == 0) && (nodes[2] == edgeid)) {
        uVar2 = ref_dict_location(ref_dict,nodes[0],&local);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "localize";
          uVar6 = 0xc87;
          goto LAB_0014f50e;
        }
        uVar2 = ref_geom_cell_tuv(ref_geom,nodes[0],nodes,1,&tvalue,&sens);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "from";
          uVar6 = 0xc8a;
          goto LAB_0014f50e;
        }
        if (sens == -1) {
          local = local_154;
          uVar5 = local_130 & 0xffffffff;
        }
        else {
          uVar5 = (ulong)(local + 1);
        }
        fprintf(local_138," %d",uVar5);
        uVar2 = ref_dict_location(ref_dict,nodes[1],&local);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "localize";
          uVar6 = 0xc8d;
          goto LAB_0014f50e;
        }
        uVar2 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&tvalue,&sens);
        pFVar12 = local_138;
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar8 = "from";
          uVar6 = 0xc90;
          goto LAB_0014f50e;
        }
        if (sens == -1) {
          local = local_154;
          uVar5 = local_130 & 0xffffffff;
        }
        else {
          uVar5 = (ulong)(local + 1);
        }
        fprintf(local_138," %d",uVar5);
        fputc(10,pFVar12);
      }
    }
    uVar2 = ref_dict_free(ref_dict);
    if (uVar2 != 0) {
      uVar5 = (ulong)uVar2;
      pcVar8 = "free dict";
      uVar6 = 0xc97;
LAB_0014f50e:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
             "ref_geom_pcrv_tec_zone",uVar5,pcVar8);
      return (REF_STATUS)uVar5;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_pcrv_tec_zone(REF_GRID ref_grid, REF_INT edgeid,
                                          REF_INT faceid, REF_INT sense,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nedg, sens;
  REF_INT jump_geom = REF_EMPTY;
  REF_DBL *t, *uv, tvalue;
  REF_DBL radius, normal[3], xyz[3], gap;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_edge(ref_geom, geom) {
    if (edgeid == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
      if (0 != ref_geom_jump(ref_geom, geom)) {
        REIS(REF_EMPTY, jump_geom, "should be only one jump per edge");
        jump_geom = geom;
      }
    }
  }
  nnode = ref_dict_n(ref_dict);
  if (REF_EMPTY != jump_geom) nnode++;

  nedg = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      nedg++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == nedg) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(file,
          "zone t=\"pcrv%df%d\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          edgeid, faceid, nnode, nedg, "point", "felineseg");

  ref_malloc(t, nnode, REF_DBL);
  ref_malloc(uv, 2 * nnode, REF_DBL);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      RSB(ref_dict_location(ref_dict, nodes[0], &local), "localize", {
        printf("edg %d %d id %d no edge geom\n", nodes[0], nodes[1], nodes[2]);
        RSS(ref_node_location(ref_node, nodes[0]), "loc");
        RSS(ref_geom_tattle(ref_geom, nodes[0]), "tatt");
      });
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[local],
                                 &(uv[2 * local])),
          "p-curve uv");
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[local],
                                 &(uv[2 * local])),
          "p-curve uv");
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, geom, &radius, normal), "curve");
      radius = ABS(radius);
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[item],
                                 &(uv[2 * item])),
          "p-curve uv");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid, &(uv[2 * item]),
                            xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * item], uv[1 + 2 * item], radius,
            t[item]);
  }
  if (REF_EMPTY != jump_geom) {
    node = ref_geom_node(ref_geom, jump_geom);
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, jump_geom, &radius, normal),
          "curve");
      radius = ABS(radius);
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[nnode - 1],
                                 &(uv[2 * (nnode - 1)])),
          "p-curve uv");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid,
                            &(uv[2 * (nnode - 1)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    node = ref_geom_node(ref_geom, jump_geom);
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode - 1)],
            uv[1 + 2 * (nnode - 1)], radius, t[nnode - 1]);
  }
  ref_free(uv);
  ref_free(t);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      RSS(ref_dict_location(ref_dict, nodes[0], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}